

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O0

void __thiscall
cmFilePathChecksum::cmFilePathChecksum
          (cmFilePathChecksum *this,string *currentSrcDir,string *currentBinDir,
          string *projectSrcDir,string *projectBinDir)

{
  string *projectBinDir_local;
  string *projectSrcDir_local;
  string *currentBinDir_local;
  string *currentSrcDir_local;
  cmFilePathChecksum *this_local;
  
  std::
  array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
  ::array(&this->parentDirs);
  setupParentDirs(this,currentSrcDir,currentBinDir,projectSrcDir,projectBinDir);
  return;
}

Assistant:

cmFilePathChecksum::cmFilePathChecksum(std::string const& currentSrcDir,
                                       std::string const& currentBinDir,
                                       std::string const& projectSrcDir,
                                       std::string const& projectBinDir)
{
  setupParentDirs(currentSrcDir, currentBinDir, projectSrcDir, projectBinDir);
}